

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

bool __thiscall
btConvexHullInternal::shiftFace
          (btConvexHullInternal *this,Face *face,btScalar amount,
          btAlignedObjectArray<btConvexHullInternal::Vertex_*> *stack)

{
  Vertex *this_00;
  Point32 PVar1;
  Edge *pEVar2;
  bool bVar3;
  int x;
  int iVar4;
  int iVar5;
  btScalar *pbVar6;
  Vertex **ppVVar7;
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *__to;
  char *__to_00;
  char *extraout_RDX_06;
  char *__to_01;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *pcVar8;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *__to_02;
  Face *in_RSI;
  btVector3 *in_RDI;
  uint in_XMM0_Da;
  btScalar bVar9;
  btVector3 bVar10;
  Int128 x_00;
  Int128 y;
  Int128 z;
  Vertex *removed_3;
  bool deeper;
  Vertex *kept;
  int end;
  int pos;
  Vertex *removed_2;
  Vertex *removed_1;
  Vertex *v;
  Int128 det;
  int64_t r1;
  int64_t r0;
  int64_t m11;
  int64_t m10;
  int64_t m01;
  int64_t m00;
  Point64 n1;
  Point64 n0;
  Vertex *removed;
  Edge *e_3;
  Edge *prevFaceEdge;
  Edge *prevIntersection;
  int prevCmp;
  Edge *e_4;
  Edge *firstFaceEdge;
  Edge *faceEdge;
  Edge *firstIntersection;
  Edge *e_2;
  Rational128 dot_1;
  Edge *e_1;
  int c;
  Rational128 dot;
  Edge *e;
  int cmp;
  Rational128 optDot;
  Edge *startEdge;
  Edge *intersection;
  int64_t shiftedDot;
  Point32 shiftedOrigin;
  int64_t origDot;
  Point64 normal;
  Point32 shift;
  btVector3 origShift;
  Point32 *in_stack_fffffffffffffa98;
  Face *in_stack_fffffffffffffaa0;
  Edge *in_stack_fffffffffffffaa8;
  btConvexHullInternal *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  btScalar in_stack_fffffffffffffacc;
  btScalar in_stack_fffffffffffffad0;
  btScalar in_stack_fffffffffffffad4;
  Point64 *in_stack_fffffffffffffaf8;
  Vertex *src;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  byte bVar11;
  int local_4ec;
  Rational128 *in_stack_fffffffffffffb20;
  Rational128 *in_stack_fffffffffffffb28;
  Point32 *local_430;
  Face *local_428;
  PointR128 local_300;
  Vertex *local_2c0;
  Int128 local_2b8;
  Int128 local_2a8;
  Int128 local_298;
  Point32 local_288;
  int64_t local_278;
  Point32 local_270;
  int64_t local_260;
  int64_t local_258;
  int64_t local_250;
  int64_t local_248;
  int64_t local_240;
  Point64 local_238;
  Point64 local_220;
  Vertex *local_208;
  Edge *local_1d8;
  Edge *local_1d0;
  Edge *local_1c8;
  int local_1bc;
  Edge *local_190;
  Edge *local_188;
  Edge *local_180;
  Edge *local_178;
  Edge *local_148;
  undefined1 local_140 [40];
  Edge *local_118;
  int local_10c;
  undefined1 local_108 [40];
  Edge *local_e0;
  int local_d4;
  undefined1 local_d0 [40];
  Edge *local_a8;
  Edge *local_a0;
  int64_t local_98;
  Point32 local_90;
  int64_t local_80;
  Point64 local_78;
  Point32 local_5c;
  uint local_4c;
  undefined8 local_48;
  undefined8 local_40;
  btVector3 local_38;
  uint local_1c;
  Face *local_18;
  
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  bVar10 = getBtNormal((btConvexHullInternal *)
                       CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                       (Face *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  local_48 = bVar10.m_floats._0_8_;
  local_40 = bVar10.m_floats._8_8_;
  local_4c = local_1c ^ 0x80000000;
  bVar10 = ::operator*(&in_stack_fffffffffffffab0->scaling,(btScalar *)in_stack_fffffffffffffaa8);
  local_38.m_floats._0_8_ = bVar10.m_floats._0_8_;
  local_38.m_floats._8_8_ = bVar10.m_floats._8_8_;
  pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
  if ((*pbVar6 != 0.0) ||
     (local_430 = in_stack_fffffffffffffa98, local_428 = in_stack_fffffffffffffaa0, NAN(*pbVar6))) {
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    in_stack_fffffffffffffad4 = *pbVar6;
    pbVar6 = btVector3::operator_cast_to_float_(&local_38);
    *pbVar6 = *pbVar6 / in_stack_fffffffffffffad4;
    local_430 = in_stack_fffffffffffffa98;
    local_428 = in_stack_fffffffffffffaa0;
  }
  pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
  if ((pbVar6[1] != 0.0) || (NAN(pbVar6[1]))) {
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    in_stack_fffffffffffffad0 = pbVar6[1];
    pbVar6 = btVector3::operator_cast_to_float_(&local_38);
    pbVar6[1] = pbVar6[1] / in_stack_fffffffffffffad0;
  }
  pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
  if ((pbVar6[2] != 0.0) || (NAN(pbVar6[2]))) {
    pbVar6 = btVector3::operator_cast_to_float_(in_RDI);
    in_stack_fffffffffffffacc = pbVar6[2];
    pbVar6 = btVector3::operator_cast_to_float_(&local_38);
    pbVar6[2] = pbVar6[2] / in_stack_fffffffffffffacc;
  }
  pbVar6 = btVector3::operator_cast_to_float_(&local_38);
  x = (int)pbVar6[(int)in_RDI[10].m_floats[2]];
  pbVar6 = btVector3::operator_cast_to_float_(&local_38);
  iVar4 = (int)pbVar6[(int)in_RDI[10].m_floats[3]];
  pbVar6 = btVector3::operator_cast_to_float_(&local_38);
  Point32::Point32(&local_5c,x,iVar4,(int)pbVar6[(int)in_RDI[10].m_floats[1]]);
  bVar3 = Point32::isZero(&local_5c);
  if (bVar3) {
    return true;
  }
  Face::getNormal(local_428);
  local_80 = Point32::dot(&local_18->origin,&local_78);
  local_90 = Point32::operator+((Point32 *)local_428,local_430);
  local_98 = Point32::dot(&local_90,&local_78);
  if (local_80 <= local_98) {
    return false;
  }
  local_a0 = (Edge *)0x0;
  local_a8 = local_18->nearbyVertex->edges;
  Vertex::dot((Vertex *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
              in_stack_fffffffffffffaf8);
  local_d4 = Rational128::compare
                       ((Rational128 *)CONCAT44(in_stack_fffffffffffffacc,iVar4),
                        CONCAT44(x,in_stack_fffffffffffffac0));
  if (local_d4 < 0) {
    local_118 = local_a8;
    do {
      Vertex::dot((Vertex *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                  in_stack_fffffffffffffaf8);
      iVar5 = Rational128::compare(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
      pcVar8 = extraout_RDX_01;
      if (0 < iVar5) {
        local_d4 = Rational128::compare
                             ((Rational128 *)CONCAT44(in_stack_fffffffffffffacc,iVar4),
                              CONCAT44(x,in_stack_fffffffffffffac0));
        if (-1 < local_d4) {
          local_a0 = local_118;
          pcVar8 = extraout_RDX_02;
          break;
        }
        memcpy(local_d0,local_140,0x25);
        local_118 = local_118->reverse;
        pcVar8 = extraout_RDX_03;
        local_a8 = local_118;
      }
      local_118 = local_118->prev;
    } while (local_118 != local_a8);
    if (local_a0 == (Edge *)0x0) {
      return true;
    }
  }
  else {
    local_e0 = local_a8;
    do {
      Vertex::dot((Vertex *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                  in_stack_fffffffffffffaf8);
      iVar5 = Rational128::compare(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
      pcVar8 = extraout_RDX;
      if (iVar5 < 0) {
        local_10c = Rational128::compare
                              ((Rational128 *)CONCAT44(in_stack_fffffffffffffacc,iVar4),
                               CONCAT44(x,in_stack_fffffffffffffac0));
        memcpy(local_d0,local_108,0x25);
        local_e0 = local_e0->reverse;
        pcVar8 = extraout_RDX_00;
        local_a8 = local_e0;
        pEVar2 = local_e0;
        if (local_10c < 0) break;
        local_d4 = local_10c;
      }
      local_e0 = local_e0->prev;
      pEVar2 = local_a0;
    } while (local_e0 != local_a8);
    local_a0 = pEVar2;
    if (local_a0 == (Edge *)0x0) {
      return false;
    }
  }
  if (local_d4 == 0) {
    local_148 = local_a0->reverse->next;
    while( true ) {
      Vertex::dot((Vertex *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                  in_stack_fffffffffffffaf8);
      iVar5 = Rational128::compare
                        ((Rational128 *)CONCAT44(in_stack_fffffffffffffacc,iVar4),
                         CONCAT44(x,in_stack_fffffffffffffac0));
      pcVar8 = extraout_RDX_04;
      if (0 < iVar5) break;
      local_148 = local_148->next;
      if (local_148 == local_a0->reverse) {
        return true;
      }
    }
  }
  local_178 = (Edge *)0x0;
  local_180 = (Edge *)0x0;
  local_188 = (Edge *)0x0;
  do {
    if (local_d4 == 0) {
      local_190 = local_a0->reverse->next;
      local_a8 = local_190;
      while( true ) {
        Vertex::dot((Vertex *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                    in_stack_fffffffffffffaf8);
        iVar5 = Rational128::compare
                          ((Rational128 *)CONCAT44(in_stack_fffffffffffffacc,iVar4),
                           CONCAT44(x,in_stack_fffffffffffffac0));
        pcVar8 = extraout_RDX_05;
        if (-1 < iVar5) break;
        local_a0 = local_190->reverse;
        local_190 = local_190->next;
        if (local_190 == local_a8) {
          return true;
        }
      }
    }
    if (local_178 == (Edge *)0x0) {
      local_178 = local_a0;
    }
    else if (local_a0 == local_178) {
      if (local_d4 < 1) {
        if (local_188 != local_180->reverse) {
          btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                    ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                     in_stack_fffffffffffffab0,(Vertex **)in_stack_fffffffffffffaa8);
          while (local_188->next != local_180->reverse) {
            removeEdgePair(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
            btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                      ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                       in_stack_fffffffffffffab0,(Vertex **)in_stack_fffffffffffffaa8);
          }
          btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                    ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                     in_stack_fffffffffffffab0,(Vertex **)in_stack_fffffffffffffaa8);
        }
      }
      else {
        local_188->reverse->target = local_180->target;
        Edge::link(local_178->reverse,(char *)local_188,pcVar8);
        Edge::link(local_188,(char *)local_180->reverse,__to_02);
      }
      ppVVar7 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::operator[](in_RDX,0);
      *(Vertex **)(in_RDI[0xb].m_floats + 2) = *ppVVar7;
      local_4ec = 0;
      while (iVar4 = local_4ec,
            iVar5 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::size(in_RDX),
            iVar4 < iVar5) {
        iVar4 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::size(in_RDX);
        while (local_4ec < iVar4) {
          ppVVar7 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::operator[]
                              (in_RDX,local_4ec);
          this_00 = *ppVVar7;
          bVar11 = 0;
          local_4ec = local_4ec + 1;
          while( true ) {
            iVar5 = local_4ec + 1;
            ppVVar7 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::operator[]
                                (in_RDX,local_4ec);
            src = *ppVVar7;
            local_4ec = iVar5;
            if (src == (Vertex *)0x0) break;
            Vertex::receiveNearbyFaces(this_00,src);
            while (src->edges != (Edge *)0x0) {
              if ((bVar11 & 1) == 0) {
                bVar11 = 1;
                btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                          ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                           in_stack_fffffffffffffab0,(Vertex **)in_stack_fffffffffffffaa8);
              }
              btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                        ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                         in_stack_fffffffffffffab0,(Vertex **)in_stack_fffffffffffffaa8);
              removeEdgePair(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
            }
          }
          if ((bVar11 & 1) != 0) {
            btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                      ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                       in_stack_fffffffffffffab0,(Vertex **)in_stack_fffffffffffffaa8);
          }
        }
      }
      btAlignedObjectArray<btConvexHullInternal::Vertex_*>::resize
                ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)CONCAT44(x,iVar4),
                 in_stack_fffffffffffffabc,(Vertex **)in_stack_fffffffffffffab0);
      PVar1 = local_90;
      (local_18->origin).x = local_90.x;
      (local_18->origin).y = local_90.y;
      local_90._8_8_ = PVar1._8_8_;
      (local_18->origin).z = local_90.z;
      (local_18->origin).index = local_90.index;
      return true;
    }
    local_1bc = local_d4;
    local_1c8 = local_a0;
    local_1d0 = local_180;
    local_1d8 = local_a0->reverse;
    do {
      local_1d8 = local_1d8->reverse->prev;
      Vertex::dot((Vertex *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
                  in_stack_fffffffffffffaf8);
      local_d4 = Rational128::compare
                           ((Rational128 *)CONCAT44(in_stack_fffffffffffffacc,iVar4),
                            CONCAT44(x,in_stack_fffffffffffffac0));
    } while (local_d4 < 0);
    local_a0 = local_1d8;
    pcVar8 = __to;
    if (0 < local_d4) {
      local_208 = local_1d8->target;
      local_1d8 = local_1d8->reverse;
      if (local_1d8->prev == local_1d8) {
        local_208->edges = (Edge *)0x0;
      }
      else {
        local_208->edges = local_1d8->prev;
        Edge::link(local_1d8->prev,(char *)local_1d8->next,__to);
        Edge::link(local_1d8,(char *)local_1d8,__to_00);
      }
      Face::getNormal(local_428);
      Face::getNormal(local_428);
      local_240 = Point32::dot(&local_18->dir0,&local_220);
      local_248 = Point32::dot(&local_18->dir1,&local_220);
      local_250 = Point32::dot(&local_18->dir0,&local_238);
      local_258 = Point32::dot(&local_18->dir1,&local_238);
      local_270 = Point32::operator-((Point32 *)local_428,local_430);
      local_260 = Point32::dot(&local_270,&local_220);
      local_288 = Point32::operator-((Point32 *)local_428,local_430);
      local_278 = Point32::dot(&local_288,&local_238);
      local_2a8 = Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8)
      ;
      local_2b8 = Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8)
      ;
      local_298 = Int128::operator-((Int128 *)in_stack_fffffffffffffab0,
                                    (Int128 *)in_stack_fffffffffffffaa8);
      local_2c0 = Pool<btConvexHullInternal::Vertex>::newObject
                            ((Pool<btConvexHullInternal::Vertex> *)
                             CONCAT44(x,in_stack_fffffffffffffac0));
      (local_2c0->point).index = -1;
      local_2c0->copy = -1;
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::operator-((Int128 *)in_stack_fffffffffffffab0,(Int128 *)in_stack_fffffffffffffaa8);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::operator+((Int128 *)local_428,(Int128 *)local_430);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::operator-((Int128 *)in_stack_fffffffffffffab0,(Int128 *)in_stack_fffffffffffffaa8);
      Int128::operator*((Int128 *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                        CONCAT44(in_stack_fffffffffffffacc,iVar4));
      x_00 = Int128::operator+((Int128 *)local_428,(Int128 *)local_430);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::operator-((Int128 *)in_stack_fffffffffffffab0,(Int128 *)in_stack_fffffffffffffaa8);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::operator+((Int128 *)local_428,(Int128 *)local_430);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::operator-((Int128 *)in_stack_fffffffffffffab0,(Int128 *)in_stack_fffffffffffffaa8);
      Int128::operator*((Int128 *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                        CONCAT44(in_stack_fffffffffffffacc,iVar4));
      y = Int128::operator+((Int128 *)local_428,(Int128 *)local_430);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::operator-((Int128 *)in_stack_fffffffffffffab0,(Int128 *)in_stack_fffffffffffffaa8);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::operator+((Int128 *)local_428,(Int128 *)local_430);
      Int128::mul((int64_t)in_stack_fffffffffffffab0,(int64_t)in_stack_fffffffffffffaa8);
      Int128::operator-((Int128 *)in_stack_fffffffffffffab0,(Int128 *)in_stack_fffffffffffffaa8);
      Int128::operator*((Int128 *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                        CONCAT44(in_stack_fffffffffffffacc,iVar4));
      z = Int128::operator+((Int128 *)local_428,(Int128 *)local_430);
      local_430 = (Point32 *)z.low;
      local_428 = (Face *)z.high;
      in_stack_fffffffffffffaa8 = (Edge *)local_298.low;
      in_stack_fffffffffffffab0 = (btConvexHullInternal *)local_298.high;
      PointR128::PointR128(&local_300,x_00,y,z,local_298);
      memcpy(&local_2c0->point128,&local_300,0x40);
      bVar9 = PointR128::xvalue((PointR128 *)local_428);
      (local_2c0->point).x = (int)bVar9;
      bVar9 = PointR128::yvalue((PointR128 *)local_428);
      (local_2c0->point).y = (int)bVar9;
      bVar9 = PointR128::zvalue((PointR128 *)local_428);
      (local_2c0->point).z = (int)bVar9;
      local_a0->target = local_2c0;
      local_2c0->edges = local_1d8;
      btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)in_stack_fffffffffffffab0,
                 (Vertex **)in_stack_fffffffffffffaa8);
      btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)in_stack_fffffffffffffab0,
                 (Vertex **)in_stack_fffffffffffffaa8);
      btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)in_stack_fffffffffffffab0,
                 (Vertex **)in_stack_fffffffffffffaa8);
      pcVar8 = extraout_RDX_06;
    }
    if (((local_d4 == 0) && (local_1bc == 0)) &&
       (local_1c8->reverse->next->target == local_a0->target)) {
      local_180 = local_1c8->reverse->next;
    }
    else {
      local_180 = newEdgePair((btConvexHullInternal *)CONCAT44(x,in_stack_fffffffffffffac0),
                              (Vertex *)
                              CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                              (Vertex *)in_stack_fffffffffffffab0);
      pcVar8 = __to_01;
      if (local_1bc == 0) {
        Edge::link(local_180,(char *)local_1c8->reverse->next,__to_01);
        pcVar8 = extraout_RDX_07;
      }
      if ((local_1bc == 0) || (local_1d0 != (Edge *)0x0)) {
        Edge::link(local_1c8->reverse,(char *)local_180,pcVar8);
        pcVar8 = extraout_RDX_08;
      }
      if (local_d4 == 0) {
        Edge::link(local_a0->reverse->prev,(char *)local_180->reverse,pcVar8);
        pcVar8 = extraout_RDX_09;
      }
      Edge::link(local_180->reverse,(char *)local_a0->reverse,pcVar8);
      pcVar8 = extraout_RDX_10;
    }
    if (local_1d0 != (Edge *)0x0) {
      if (local_1bc < 1) {
        if (local_180 != local_1d0->reverse) {
          btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                    ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                     in_stack_fffffffffffffab0,(Vertex **)in_stack_fffffffffffffaa8);
          while (local_180->next != local_1d0->reverse) {
            removeEdgePair(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
            btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                      ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                       in_stack_fffffffffffffab0,(Vertex **)in_stack_fffffffffffffaa8);
          }
          btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                    ((btAlignedObjectArray<btConvexHullInternal::Vertex_*> *)
                     in_stack_fffffffffffffab0,(Vertex **)in_stack_fffffffffffffaa8);
          pcVar8 = extraout_RDX_12;
        }
      }
      else {
        Edge::link(local_180,(char *)local_1d0->reverse,pcVar8);
        pcVar8 = extraout_RDX_11;
      }
    }
    local_180->face = local_18;
    local_180->reverse->face = local_a0->face;
    if (local_188 == (Edge *)0x0) {
      local_188 = local_180;
    }
  } while( true );
}

Assistant:

bool btConvexHullInternal::shiftFace(Face* face, btScalar amount, btAlignedObjectArray<Vertex*> stack)
{
	btVector3 origShift = getBtNormal(face) * -amount;
	if (scaling[0] != 0)
	{
		origShift[0] /= scaling[0];
	}
	if (scaling[1] != 0)
	{
		origShift[1] /= scaling[1];
	}
	if (scaling[2] != 0)
	{
		origShift[2] /= scaling[2];
	}
	Point32 shift((int32_t) origShift[medAxis], (int32_t) origShift[maxAxis], (int32_t) origShift[minAxis]);
	if (shift.isZero())
	{
		return true;
	}
	Point64 normal = face->getNormal();
#ifdef DEBUG_CONVEX_HULL
	printf("\nShrinking face (%d %d %d) (%d %d %d) (%d %d %d) by (%d %d %d)\n",
				 face->origin.x, face->origin.y, face->origin.z, face->dir0.x, face->dir0.y, face->dir0.z, face->dir1.x, face->dir1.y, face->dir1.z, shift.x, shift.y, shift.z);
#endif
	int64_t origDot = face->origin.dot(normal);
	Point32 shiftedOrigin = face->origin + shift;
	int64_t shiftedDot = shiftedOrigin.dot(normal);
	btAssert(shiftedDot <= origDot);
	if (shiftedDot >= origDot)
	{
		return false;
	}

	Edge* intersection = NULL;

	Edge* startEdge = face->nearbyVertex->edges;
#ifdef DEBUG_CONVEX_HULL
	printf("Start edge is ");
	startEdge->print();
	printf(", normal is (%lld %lld %lld), shifted dot is %lld\n", normal.x, normal.y, normal.z, shiftedDot);
#endif
	Rational128 optDot = face->nearbyVertex->dot(normal);
	int cmp = optDot.compare(shiftedDot);
#ifdef SHOW_ITERATIONS
	int n = 0;
#endif
	if (cmp >= 0)
	{
		Edge* e = startEdge;
		do
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			Rational128 dot = e->target->dot(normal);
			btAssert(dot.compare(origDot) <= 0);
#ifdef DEBUG_CONVEX_HULL
			printf("Moving downwards, edge is ");
			e->print();
			printf(", dot is %f (%f %lld)\n", (float) dot.toScalar(), (float) optDot.toScalar(), shiftedDot);
#endif
			if (dot.compare(optDot) < 0)
			{
				int c = dot.compare(shiftedDot);
				optDot = dot;
				e = e->reverse;
				startEdge = e;
				if (c < 0)
				{
					intersection = e;
					break;
				}
				cmp = c;
			}
			e = e->prev;
		} while (e != startEdge);

		if (!intersection)
		{
			return false;
		}
	}
	else
	{
		Edge* e = startEdge;
		do
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			Rational128 dot = e->target->dot(normal);
			btAssert(dot.compare(origDot) <= 0);
#ifdef DEBUG_CONVEX_HULL
			printf("Moving upwards, edge is ");
			e->print();
			printf(", dot is %f (%f %lld)\n", (float) dot.toScalar(), (float) optDot.toScalar(), shiftedDot);
#endif
			if (dot.compare(optDot) > 0)
			{
				cmp = dot.compare(shiftedDot);
				if (cmp >= 0)
				{
					intersection = e;
					break;
				}
				optDot = dot;
				e = e->reverse;
				startEdge = e;
			}
			e = e->prev;
		} while (e != startEdge);
		
		if (!intersection)
		{
			return true;
		}
	}

#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to find initial intersection\n", n);
#endif

	if (cmp == 0)
	{
		Edge* e = intersection->reverse->next;
#ifdef SHOW_ITERATIONS
		n = 0;
#endif
		while (e->target->dot(normal).compare(shiftedDot) <= 0)
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			e = e->next;
			if (e == intersection->reverse)
			{
				return true;
			}
#ifdef DEBUG_CONVEX_HULL
			printf("Checking for outwards edge, current edge is ");
			e->print();
			printf("\n");
#endif
		}
#ifdef SHOW_ITERATIONS
		printf("Needed %d iterations to check for complete containment\n", n);
#endif
	}
	
	Edge* firstIntersection = NULL;
	Edge* faceEdge = NULL;
	Edge* firstFaceEdge = NULL;

#ifdef SHOW_ITERATIONS
	int m = 0;
#endif
	while (true)
	{
#ifdef SHOW_ITERATIONS
		m++;
#endif
#ifdef DEBUG_CONVEX_HULL
		printf("Intersecting edge is ");
		intersection->print();
		printf("\n");
#endif
		if (cmp == 0)
		{
			Edge* e = intersection->reverse->next;
			startEdge = e;
#ifdef SHOW_ITERATIONS
			n = 0;
#endif
			while (true)
			{
#ifdef SHOW_ITERATIONS
				n++;
#endif
				if (e->target->dot(normal).compare(shiftedDot) >= 0)
				{
					break;
				}
				intersection = e->reverse;
				e = e->next;
				if (e == startEdge)
				{
					return true;
				}
			}
#ifdef SHOW_ITERATIONS
			printf("Needed %d iterations to advance intersection\n", n);
#endif
		}

#ifdef DEBUG_CONVEX_HULL
		printf("Advanced intersecting edge to ");
		intersection->print();
		printf(", cmp = %d\n", cmp);
#endif

		if (!firstIntersection)
		{
			firstIntersection = intersection;
		}
		else if (intersection == firstIntersection)
		{
			break;
		}

		int prevCmp = cmp;
		Edge* prevIntersection = intersection;
		Edge* prevFaceEdge = faceEdge;

		Edge* e = intersection->reverse;
#ifdef SHOW_ITERATIONS
		n = 0;
#endif
		while (true)
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			e = e->reverse->prev;
			btAssert(e != intersection->reverse);
			cmp = e->target->dot(normal).compare(shiftedDot);
#ifdef DEBUG_CONVEX_HULL
			printf("Testing edge ");
			e->print();
			printf(" -> cmp = %d\n", cmp);
#endif
			if (cmp >= 0)
			{
				intersection = e;
				break;
			}
		}
#ifdef SHOW_ITERATIONS
		printf("Needed %d iterations to find other intersection of face\n", n);
#endif

		if (cmp > 0)
		{
			Vertex* removed = intersection->target;
			e = intersection->reverse;
			if (e->prev == e)
			{
				removed->edges = NULL;
			}
			else
			{
				removed->edges = e->prev;
				e->prev->link(e->next);
				e->link(e);
			}
#ifdef DEBUG_CONVEX_HULL
			printf("1: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
			
			Point64 n0 = intersection->face->getNormal();
			Point64 n1 = intersection->reverse->face->getNormal();
			int64_t m00 = face->dir0.dot(n0);
			int64_t m01 = face->dir1.dot(n0);
			int64_t m10 = face->dir0.dot(n1);
			int64_t m11 = face->dir1.dot(n1);
			int64_t r0 = (intersection->face->origin - shiftedOrigin).dot(n0);
			int64_t r1 = (intersection->reverse->face->origin - shiftedOrigin).dot(n1);
			Int128 det = Int128::mul(m00, m11) - Int128::mul(m01, m10);
			btAssert(det.getSign() != 0);
			Vertex* v = vertexPool.newObject();
			v->point.index = -1;
			v->copy = -1;
			v->point128 = PointR128(Int128::mul(face->dir0.x * r0, m11) - Int128::mul(face->dir0.x * r1, m01)
															+ Int128::mul(face->dir1.x * r1, m00) - Int128::mul(face->dir1.x * r0, m10) + det * shiftedOrigin.x,
															Int128::mul(face->dir0.y * r0, m11) - Int128::mul(face->dir0.y * r1, m01)
															+ Int128::mul(face->dir1.y * r1, m00) - Int128::mul(face->dir1.y * r0, m10) + det * shiftedOrigin.y,
															Int128::mul(face->dir0.z * r0, m11) - Int128::mul(face->dir0.z * r1, m01)
															+ Int128::mul(face->dir1.z * r1, m00) - Int128::mul(face->dir1.z * r0, m10) + det * shiftedOrigin.z,
															det);
			v->point.x = (int32_t) v->point128.xvalue();
			v->point.y = (int32_t) v->point128.yvalue();
			v->point.z = (int32_t) v->point128.zvalue();
			intersection->target = v;
			v->edges = e;

			stack.push_back(v);
			stack.push_back(removed);
			stack.push_back(NULL);
		}

		if (cmp || prevCmp || (prevIntersection->reverse->next->target != intersection->target))
		{
			faceEdge = newEdgePair(prevIntersection->target, intersection->target);
			if (prevCmp == 0)
			{
				faceEdge->link(prevIntersection->reverse->next);
			}
			if ((prevCmp == 0) || prevFaceEdge)
			{
				prevIntersection->reverse->link(faceEdge);
			}
			if (cmp == 0)
			{
				intersection->reverse->prev->link(faceEdge->reverse);
			}
			faceEdge->reverse->link(intersection->reverse);
		}
		else
		{
			faceEdge = prevIntersection->reverse->next;
		}

		if (prevFaceEdge)
		{
			if (prevCmp > 0)
			{
				faceEdge->link(prevFaceEdge->reverse);
			}
			else if (faceEdge != prevFaceEdge->reverse)
			{
				stack.push_back(prevFaceEdge->target);
				while (faceEdge->next != prevFaceEdge->reverse)
				{
					Vertex* removed = faceEdge->next->target;
					removeEdgePair(faceEdge->next);
					stack.push_back(removed);
#ifdef DEBUG_CONVEX_HULL
					printf("2: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
				}
				stack.push_back(NULL);
			}
		}
		faceEdge->face = face;
		faceEdge->reverse->face = intersection->face;

		if (!firstFaceEdge)
		{
			firstFaceEdge = faceEdge;
		}
	}
#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to process all intersections\n", m);
#endif

	if (cmp > 0)
	{
		firstFaceEdge->reverse->target = faceEdge->target;
		firstIntersection->reverse->link(firstFaceEdge);
		firstFaceEdge->link(faceEdge->reverse);
	}
	else if (firstFaceEdge != faceEdge->reverse)
	{
		stack.push_back(faceEdge->target);
		while (firstFaceEdge->next != faceEdge->reverse)
		{
			Vertex* removed = firstFaceEdge->next->target;
			removeEdgePair(firstFaceEdge->next);
			stack.push_back(removed);
#ifdef DEBUG_CONVEX_HULL
			printf("3: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
		}
		stack.push_back(NULL);
	}

	btAssert(stack.size() > 0);
	vertexList = stack[0];

#ifdef DEBUG_CONVEX_HULL
	printf("Removing part\n");
#endif
#ifdef SHOW_ITERATIONS
	n = 0;
#endif
	int pos = 0;
	while (pos < stack.size())
	{
		int end = stack.size();
		while (pos < end)
		{
			Vertex* kept = stack[pos++];
#ifdef DEBUG_CONVEX_HULL
			kept->print();
#endif
			bool deeper = false;
			Vertex* removed;
			while ((removed = stack[pos++]) != NULL)
			{
#ifdef SHOW_ITERATIONS
				n++;
#endif
				kept->receiveNearbyFaces(removed);
				while (removed->edges)
				{
					if (!deeper)
					{
						deeper = true;
						stack.push_back(kept);
					}
					stack.push_back(removed->edges->target);
					removeEdgePair(removed->edges);
				}
			}
			if (deeper)
			{
				stack.push_back(NULL);
			}
		}
	}
#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to remove part\n", n);
#endif

	stack.resize(0);
	face->origin = shiftedOrigin;

	return true;
}